

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmGen9TextureCalc::Fill1DTexOffsetAddress
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  GMM_GFX_SIZE_T GVar1;
  ulong uVar2;
  uint local_1c;
  uint32_t i;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen9TextureCalc *this_local;
  
  uVar2 = (ulong)((pTexInfo->Alignment).QPitch * pTexInfo->BitsPerPixel >> 3);
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = uVar2;
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = uVar2;
  for (local_1c = 0; local_1c <= pTexInfo->MaxLod; local_1c = local_1c + 1) {
    GVar1 = Get1DTexOffsetAddressPerMip(this,pTexInfo,local_1c);
    *(GMM_GFX_SIZE_T *)(pTexInfo->MmcHint + (ulong)local_1c * 8 + 0x80) = GVar1;
  }
  return;
}

Assistant:

void GmmLib::GmmGen9TextureCalc::Fill1DTexOffsetAddress(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t i;

    GMM_DPF_ENTER;

    pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender =
    pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock =
    pTexInfo->Alignment.QPitch * pTexInfo->BitsPerPixel >> 3;

    for(i = 0; i <= pTexInfo->MaxLod; i++)
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[i] = Get1DTexOffsetAddressPerMip(pTexInfo, i);
    }

    GMM_DPF_EXIT;
}